

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O1

void __thiscall QInputDialogPrivate::setListViewText(QInputDialogPrivate *this,QString *text)

{
  QComboBox *this_00;
  int iVar1;
  QAbstractItemModel *pQVar2;
  QItemSelectionModel *pQVar3;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->comboBox;
  ::QVariant::QVariant((QVariant *)&local_48,(QString *)text);
  iVar1 = QComboBox::findData(this_00,(QVariant *)&local_48,0,(MatchFlags)0x10);
  ::QVariant::~QVariant((QVariant *)&local_48);
  if (iVar1 != -1) {
    local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = QComboBox::model(this->comboBox);
    (**(code **)(*(long *)pQVar2 + 0x60))(&local_48,pQVar2,iVar1,0);
    pQVar3 = QAbstractItemView::selectionModel((QAbstractItemView *)this->listView);
    (**(code **)(*(long *)pQVar3 + 0x60))(pQVar3,&local_48,0x13);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialogPrivate::setListViewText(const QString &text)
{
    int row = comboBox->findText(text);
    if (row != -1) {
        QModelIndex index(comboBox->model()->index(row, 0));
        listView->selectionModel()->setCurrentIndex(index, QItemSelectionModel::Clear
                                                         | QItemSelectionModel::SelectCurrent);
    }
}